

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

bool __thiscall BinGE<1,_0,_1>::propagate(BinGE<1,_0,_1> *this)

{
  BoolView *this_00;
  int iVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Lit LVar5;
  int iVar6;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  ulong uVar7;
  IntVar *pIVar8;
  int iVar9;
  int64_t m_v;
  long lVar10;
  
  this_00 = &this->r;
  bVar2 = BoolView::isFalse(this_00);
  if (!bVar2) {
    pIVar8 = (this->x).var;
    lVar10 = -(long)(pIVar8->min).v;
    iVar6 = (((this->y).var)->min).v;
    iVar9 = (int)lVar10;
    if ((iVar9 < iVar6) && ((uint)(this->r).s * 2 + -1 != (int)sat.assigns.data[(uint)(this->r).v]))
    {
      if (so.lazy == true) {
        iVar3 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[8])();
        uVar4 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
        r._a = (ulong)uVar4 << 0x20 | (long)iVar3 << 2 | 3;
      }
      else {
        r._pt = (Clause *)0x0;
      }
      bVar2 = BoolView::setVal(this_00,false,(Reason)r);
      if (!bVar2) {
        return false;
      }
    }
    bVar2 = BoolView::isTrue(this_00);
    if (!bVar2) {
      return true;
    }
    pIVar8 = (this->x).var;
    iVar3 = (pIVar8->max).v;
    iVar1 = -iVar3;
    if (iVar6 != iVar1 && SBORROW4(iVar6,iVar1) == iVar6 + iVar3 < 0) {
      if (so.lazy == true) {
        iVar3 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
        LVar5 = BoolView::getValLit(this_00);
        uVar7 = (ulong)(uint)LVar5.x << 0x20 | (long)iVar3 << 2 | 3;
        pIVar8 = (this->x).var;
      }
      else {
        uVar7 = 0;
      }
      iVar6 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0xf])
                        (pIVar8,-(long)iVar6,uVar7,1);
      if ((char)iVar6 == '\0') {
        return false;
      }
    }
    pIVar8 = (this->y).var;
    iVar6 = (pIVar8->max).v;
    if (iVar9 < iVar6) {
      if (so.lazy == true) {
        iVar6 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
        LVar5 = BoolView::getValLit(this_00);
        uVar7 = (ulong)(uint)LVar5.x << 0x20 | (long)iVar6 << 2 | 3;
        pIVar8 = (this->y).var;
      }
      else {
        uVar7 = 0;
      }
      iVar6 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0xf])(pIVar8,lVar10,uVar7,1);
      if ((char)iVar6 == '\0') {
        return false;
      }
      iVar6 = (((this->y).var)->max).v;
    }
    iVar9 = (((this->x).var)->max).v;
    iVar3 = -iVar9;
    if (iVar6 == iVar3 || SBORROW4(iVar6,iVar3) != iVar6 + iVar9 < 0) {
      Tchar::operator=(&(this->super_Propagator).satisfied,'\x01');
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();

		// Can finesse!!
		if ((R != 0) && x_max < y_min) {
			setDom(r, setVal, 0, x.getMaxLit(), y.getMinLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		// Finesses x's lower bound
		if (R != 0) {
			setDom(x, setMin, y_min, y.getMinLit(), r.getValLit());
		} else {
			setDom(x, setMin, y_min, y.getMinLit());
		}
		if (R != 0) {
			setDom(y, setMax, x_max, x.getMaxLit(), r.getValLit());
		} else {
			setDom(y, setMax, x_max, x.getMaxLit());
		}

		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}

		return true;
	}